

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
 nonius::detail::
 run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
           (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
           repeater<nonius::now<std::chrono::_V2::system_clock>_> *fun)

{
  undefined8 in_RAX;
  undefined8 *puVar1;
  uint uVar2;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int_&)>
  TVar3;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
  TVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    uVar2 = seed;
    if (0x3fffffff < (int)uVar2) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = &PTR__exception_0020c2b8;
      __cxa_throw(puVar1,&optimized_away_error::typeinfo,std::exception::~exception);
    }
    uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
    TVar3 = measure<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>&,int&>
                      (fun,(int *)((long)&uStack_38 + 4));
    TVar4.elapsed = TVar3.elapsed.__r;
    seed = uVar2 << (TVar4.elapsed.__r < how_long.__r);
  } while (TVar4.elapsed.__r < how_long.__r);
  TVar4._8_8_ = (ulong)uVar2 << 0x20;
  return TVar4;
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }